

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

int __thiscall
soplex::SPxFastRT<double>::minSelect
          (SPxFastRT<double> *this,double *val,double *stab,double *best,double *bestDelta,
          double max,UpdateVector<double> *update,VectorBase<double> *lowBound,
          VectorBase<double> *upBound,int start,int incr)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  SSVectorBase<double> *this_00;
  int *piVar4;
  SPxId *pSVar5;
  Status *pSVar6;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double *in_R8;
  UpdateVector<double> *in_R9;
  double in_XMM0_Qa;
  int in_stack_00000018;
  int in_stack_00000020;
  int bestNr;
  int nr;
  int *last;
  int *idx;
  double *upd;
  double *vec;
  double *low;
  double *up;
  bool enterrowrep;
  bool leaving;
  double y;
  double x;
  int i;
  SPxColId *in_stack_ffffffffffffff38;
  SPxSolverBase<double> *in_stack_ffffffffffffff40;
  bool local_99;
  SPxColId local_98;
  int local_90;
  int local_8c;
  int *local_88;
  int *local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  bool local_52;
  byte local_51;
  double local_50;
  double local_48;
  int local_3c;
  UpdateVector<double> *local_38;
  double local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  double *local_10;
  
  local_51 = *(int *)(in_RDI + 0x18) == 1;
  local_99 = false;
  if (!(bool)local_51) {
    local_99 = *(int *)(*(long *)(in_RDI + 8) + 0x2f0) == -1;
  }
  local_52 = local_99;
  local_38 = in_R9;
  local_30 = in_XMM0_Qa;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_60 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f4e93);
  local_68 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f4ea5);
  local_70 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2f4eb7);
  UpdateVector<double>::delta(local_38);
  local_78 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2f4ed1);
  this_00 = UpdateVector<double>::delta(local_38);
  piVar4 = SSVectorBase<double>::indexMem(this_00);
  local_80 = piVar4;
  UpdateVector<double>::delta(local_38);
  iVar3 = SSVectorBase<double>::size((SSVectorBase<double> *)0x2f4f0f);
  local_88 = piVar4 + iVar3;
  local_8c = -1;
  local_90 = -1;
  for (local_80 = local_80 + in_stack_00000018; local_80 < local_88;
      local_80 = local_80 + in_stack_00000020) {
    local_3c = *local_80;
    local_48 = local_78[local_3c];
    if (((local_51 & 1) == 0) ||
       ((((*(byte *)(in_RDI + 0x50) & 1) == 0 ||
         (bVar1 = SPxSolverBase<double>::isCoBasic
                            (in_stack_ffffffffffffff40,
                             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20)), !bVar1)) &&
        (((*(byte *)(in_RDI + 0x50) & 1) != 0 ||
         (bVar1 = SPxSolverBase<double>::isBasic
                            (in_stack_ffffffffffffff40,
                             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20)), !bVar1)))))) {
      bVar1 = false;
      if ((local_52 & 1U) != 0) {
        pSVar5 = SPxBasisBase<double>::baseId
                           ((SPxBasisBase<double> *)in_stack_ffffffffffffff40,
                            (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        bVar2 = SPxId::isSPxColId(pSVar5);
        bVar1 = false;
        if (bVar2) {
          in_stack_ffffffffffffff40 =
               (SPxSolverBase<double> *)
               SPxBasisBase<double>::desc((SPxBasisBase<double> *)(*(long *)(in_RDI + 8) + 0x1c8));
          in_stack_ffffffffffffff38 = *(SPxColId **)(in_RDI + 8);
          pSVar5 = SPxBasisBase<double>::baseId
                             ((SPxBasisBase<double> *)in_stack_ffffffffffffff40,
                              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          SPxColId::SPxColId(&local_98,pSVar5);
          SPxLPBase<double>::number
                    (&in_stack_ffffffffffffff40->super_SPxLPBase<double>,in_stack_ffffffffffffff38);
          pSVar6 = SPxBasisBase<double>::Desc::colStatus
                             ((Desc *)in_stack_ffffffffffffff40,
                              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          bVar1 = *pSVar6 == P_FIXED;
        }
      }
      if (!bVar1) {
        if (local_48 < *local_18 || local_48 == *local_18) {
          if (local_48 < -*local_18) {
            local_50 = (local_60[local_3c] - local_70[local_3c]) / local_48;
            if (local_50 < local_30) {
              if (local_50 < *local_20) {
                *local_20 = local_50;
                local_90 = local_3c;
              }
            }
            else {
              *local_10 = local_50;
              local_8c = local_3c;
              *local_18 = -local_48;
            }
          }
        }
        else {
          local_50 = (local_68[local_3c] - local_70[local_3c]) / local_48;
          if (local_50 < local_30) {
            if (local_50 < *local_20) {
              *local_20 = local_50;
              local_90 = local_3c;
            }
          }
          else {
            *local_10 = local_50;
            local_8c = local_3c;
            *local_18 = local_48;
          }
        }
      }
    }
  }
  if ((local_8c < 0) && (0 < local_90)) {
    if (0.0 < local_78[local_90] || local_78[local_90] == 0.0) {
      *local_28 = local_70[local_90] - local_68[local_90];
    }
    else {
      *local_28 = local_60[local_90] - local_70[local_90];
    }
  }
  return local_8c;
}

Assistant:

int SPxFastRT<R>::minSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y >= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y < best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y >= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y < best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] < 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}